

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void * a0ialloc(size_t size,_Bool zero,_Bool is_internal)

{
  rtree_ctx_cache_elm_t *prVar1;
  long *plVar2;
  void *pvVar3;
  rtree_leaf_elm_t *prVar4;
  ulong uVar5;
  _Bool _Var6;
  szind_t ind;
  void *key;
  ulong uVar7;
  rtree_leaf_elm_t *prVar8;
  atomic_p_t arena;
  ulong uVar9;
  rtree_ctx_cache_elm_t *prVar10;
  rtree_ctx_cache_elm_t *prVar11;
  rtree_leaf_elm_t *prVar12;
  uint uVar13;
  bool bVar14;
  rtree_ctx_t rtree_ctx_fallback;
  
  if ((duckdb_je_malloc_init_state == malloc_init_uninitialized) &&
     (_Var6 = malloc_init_hard_a0(), _Var6)) {
    key = (void *)0x0;
  }
  else {
    if (size < 0x1001) {
      ind = (szind_t)duckdb_je_sz_size2index_tab[size + 7 >> 3];
    }
    else {
      ind = sz_size2index_compute(size);
    }
    arena.repr = duckdb_je_arenas[0].repr;
    if (duckdb_je_arenas[0].repr == (void *)0x0) {
      arena.repr = duckdb_je_arena_init((tsdn_t *)0x0,0,&duckdb_je_arena_config_default);
    }
    key = duckdb_je_arena_malloc_hard((tsdn_t *)0x0,arena.repr,size,ind,zero,size < 0x3801);
    if ((is_internal) && (key != (void *)0x0)) {
      duckdb_je_rtree_ctx_data_init(&rtree_ctx_fallback);
      prVar4 = rtree_ctx_fallback.l2_cache[0].leaf;
      uVar13 = (uint)((ulong)key >> 0x1e) & 0xf;
      prVar12 = (rtree_leaf_elm_t *)((ulong)key & 0xffffffffc0000000);
      uVar7 = (ulong)(uVar13 << 4);
      plVar2 = (long *)((long)&rtree_ctx_fallback.cache[0].leafkey + uVar7);
      prVar8 = (rtree_leaf_elm_t *)*plVar2;
      if (prVar8 == prVar12) {
        prVar8 = (rtree_leaf_elm_t *)
                 ((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) +
                 *(long *)((long)&rtree_ctx_fallback.cache[0].leaf + uVar7));
      }
      else if ((rtree_leaf_elm_t *)rtree_ctx_fallback.l2_cache[0].leafkey == prVar12) {
        rtree_ctx_fallback.l2_cache[0].leafkey = (uintptr_t)prVar8;
        rtree_ctx_fallback.l2_cache[0].leaf =
             *(rtree_leaf_elm_t **)((long)&rtree_ctx_fallback.cache[0].leaf + uVar7);
        *plVar2 = (long)prVar12;
        *(rtree_leaf_elm_t **)((long)&rtree_ctx_fallback.cache[0].leaf + uVar7) = prVar4;
        prVar8 = (rtree_leaf_elm_t *)
                 ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
      }
      else {
        prVar10 = rtree_ctx_fallback.l2_cache + 1;
        if ((rtree_leaf_elm_t *)rtree_ctx_fallback.l2_cache[1].leafkey == prVar12) {
          uVar9 = 0;
          bVar14 = false;
        }
        else {
          uVar5 = 1;
          prVar11 = prVar10;
          do {
            uVar9 = uVar5;
            bVar14 = 6 < uVar9;
            if (uVar9 == 7) goto LAB_00cfc849;
            prVar10 = prVar11 + 1;
            prVar1 = prVar11 + 1;
            uVar5 = uVar9 + 1;
            prVar11 = prVar10;
          } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar12);
          bVar14 = 6 < uVar9;
        }
        prVar4 = prVar10->leaf;
        prVar10->leafkey = rtree_ctx_fallback.l2_cache[uVar9].leafkey;
        prVar10->leaf = rtree_ctx_fallback.l2_cache[uVar9].leaf;
        rtree_ctx_fallback.l2_cache[uVar9].leafkey = (uintptr_t)prVar8;
        rtree_ctx_fallback.l2_cache[uVar9].leaf =
             *(rtree_leaf_elm_t **)((long)&rtree_ctx_fallback.cache[0].leaf + uVar7);
        *plVar2 = (long)prVar12;
        *(rtree_leaf_elm_t **)((long)&rtree_ctx_fallback.cache[0].leaf + uVar7) = prVar4;
        prVar8 = (rtree_leaf_elm_t *)
                 ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
LAB_00cfc849:
        if (bVar14) {
          prVar8 = duckdb_je_rtree_leaf_elm_lookup_hard
                             ((tsdn_t *)0x0,&duckdb_je_arena_emap_global.rtree,&rtree_ctx_fallback,
                              (uintptr_t)key,true,false);
        }
      }
      pvVar3 = duckdb_je_arenas
               [*(uint *)(((long)(prVar8->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
                0xfff].repr;
      duckdb_je_rtree_ctx_data_init(&rtree_ctx_fallback);
      uVar7 = (ulong)(uVar13 << 4);
      plVar2 = (long *)((long)&rtree_ctx_fallback.cache[0].leafkey + uVar7);
      prVar8 = (rtree_leaf_elm_t *)*plVar2;
      if (prVar8 == prVar12) {
        prVar8 = (rtree_leaf_elm_t *)
                 ((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) +
                 *(long *)((long)&rtree_ctx_fallback.cache[0].leaf + uVar7));
      }
      else if ((rtree_leaf_elm_t *)rtree_ctx_fallback.l2_cache[0].leafkey == prVar12) {
        rtree_ctx_fallback.l2_cache[0].leafkey = (uintptr_t)prVar8;
        *plVar2 = (long)prVar12;
        *(rtree_leaf_elm_t **)((long)&rtree_ctx_fallback.cache[0].leaf + uVar7) =
             rtree_ctx_fallback.l2_cache[0].leaf;
        prVar8 = (rtree_leaf_elm_t *)
                 ((long)&((rtree_ctx_fallback.l2_cache[0].leaf)->le_bits).repr +
                 (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
      }
      else {
        prVar10 = rtree_ctx_fallback.l2_cache + 1;
        if ((rtree_leaf_elm_t *)rtree_ctx_fallback.l2_cache[1].leafkey == prVar12) {
          uVar9 = 0;
          bVar14 = false;
        }
        else {
          uVar5 = 1;
          prVar11 = prVar10;
          do {
            uVar9 = uVar5;
            bVar14 = 6 < uVar9;
            if (uVar9 == 7) goto LAB_00cfc8c8;
            prVar10 = prVar11 + 1;
            prVar1 = prVar11 + 1;
            uVar5 = uVar9 + 1;
            prVar11 = prVar10;
          } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar12);
          bVar14 = 6 < uVar9;
        }
        prVar4 = prVar10->leaf;
        prVar10->leafkey = rtree_ctx_fallback.l2_cache[uVar9].leafkey;
        prVar10->leaf = rtree_ctx_fallback.l2_cache[uVar9].leaf;
        rtree_ctx_fallback.l2_cache[uVar9].leafkey = (uintptr_t)prVar8;
        rtree_ctx_fallback.l2_cache[uVar9].leaf =
             *(rtree_leaf_elm_t **)((long)&rtree_ctx_fallback.cache[0].leaf + uVar7);
        *plVar2 = (long)prVar12;
        *(rtree_leaf_elm_t **)((long)&rtree_ctx_fallback.cache[0].leaf + uVar7) = prVar4;
        prVar8 = (rtree_leaf_elm_t *)
                 ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
LAB_00cfc8c8:
        if (bVar14) {
          prVar8 = duckdb_je_rtree_leaf_elm_lookup_hard
                             ((tsdn_t *)0x0,&duckdb_je_arena_emap_global.rtree,&rtree_ctx_fallback,
                              (uintptr_t)key,true,false);
        }
      }
      LOCK();
      plVar2 = (long *)((long)pvVar3 + 0x48);
      *plVar2 = *plVar2 + duckdb_je_sz_index2size_tab[(ulong)(prVar8->le_bits).repr >> 0x30];
      UNLOCK();
    }
  }
  return key;
}

Assistant:

static void *
a0ialloc(size_t size, bool zero, bool is_internal) {
	if (unlikely(malloc_init_a0())) {
		return NULL;
	}

	return iallocztm(TSDN_NULL, size, sz_size2index(size), zero, NULL,
	    is_internal, arena_get(TSDN_NULL, 0, true), true);
}